

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bip39.c
# Opt level: O2

int bip39_mnemonic_to_seed
              (char *mnemonic,char *passphrase,uchar *bytes_out,size_t len,size_t *written)

{
  size_t size;
  int iVar1;
  size_t sVar2;
  uchar *salt;
  
  if (passphrase == (char *)0x0) {
    sVar2 = 0;
  }
  else {
    sVar2 = strlen(passphrase);
  }
  if (written != (size_t *)0x0) {
    *written = 0;
  }
  if (len == 0x40 && (bytes_out != (uchar *)0x0 && mnemonic != (char *)0x0)) {
    size = sVar2 + 8;
    salt = (uchar *)wally_malloc(size);
    if (salt == (uchar *)0x0) {
      iVar1 = -3;
    }
    else {
      builtin_memcpy(salt,"mnemonic",8);
      if (sVar2 != 0) {
        memcpy(salt + 8,passphrase,sVar2);
      }
      sVar2 = strlen(mnemonic);
      iVar1 = wally_pbkdf2_hmac_sha512((uchar *)mnemonic,sVar2,salt,size,0,0x800,bytes_out,0x40);
      if ((written != (size_t *)0x0) && (iVar1 == 0)) {
        *written = 0x40;
      }
      clear_and_free(salt,size);
    }
  }
  else {
    iVar1 = -2;
  }
  return iVar1;
}

Assistant:

int  bip39_mnemonic_to_seed(const char *mnemonic, const char *passphrase,
                            unsigned char *bytes_out, size_t len,
                            size_t *written)
{
    const uint32_t bip9_cost = 2048u;
    const char *prefix = "mnemonic";
    const size_t prefix_len = strlen(prefix);
    const size_t passphrase_len = passphrase ? strlen(passphrase) : 0;
    const size_t salt_len = prefix_len + passphrase_len;
    unsigned char *salt;
    int ret;

    if (written)
        *written = 0;

    if (!mnemonic || !bytes_out || len != BIP39_SEED_LEN_512)
        return WALLY_EINVAL;

    salt = wally_malloc(salt_len);
    if (!salt)
        return WALLY_ENOMEM;

    memcpy(salt, prefix, prefix_len);
    if (passphrase_len)
        memcpy(salt + prefix_len, passphrase, passphrase_len);

    ret = wally_pbkdf2_hmac_sha512((unsigned char *)mnemonic, strlen(mnemonic),
                                   salt, salt_len, 0,
                                   bip9_cost, bytes_out, len);

    if (!ret && written)
        *written = BIP39_SEED_LEN_512; /* Succeeded */

    clear_and_free(salt, salt_len);

    return ret;
}